

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr * __thiscall c4::yml::Tree::key_ref(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  csubstr *pcVar3;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[node].m_type.type & KEYREF) != NOTYPE) {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          pcVar3 = (csubstr *)(*pcVar1)();
          return pcVar3;
        }
      }
      (*(code *)PTR_error_impl_00243548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((~(int)this->m_buf[node].m_type.type & 0x102U) != 0) goto LAB_001ee810;
  }
  if ((s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pcVar3 = (csubstr *)(*pcVar1)();
      return pcVar3;
    }
  }
  (*(code *)PTR_error_impl_00243548)
            ("check failed: is_key_ref(node) && ! has_key_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001ee810:
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar3 = (csubstr *)(*pcVar1)();
        return pcVar3;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_key.anchor;
}

Assistant:

csubstr    const& key_ref   (size_t node) const { RYML_ASSERT(is_key_ref(node) && ! has_key_anchor(node)); return _p(node)->m_key.anchor; }